

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void __thiscall ExpressionContext::AddFunction(ExpressionContext *this,FunctionData *function)

{
  FunctionData **ppFVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  char *pcVar4;
  ScopeData *pSVar5;
  
  pSVar5 = this->scope;
  uVar3 = (pSVar5->functions).count;
  if (uVar3 == (pSVar5->functions).max) {
    SmallArray<FunctionData_*,_2U>::grow(&pSVar5->functions,uVar3);
  }
  ppFVar1 = (pSVar5->functions).data;
  if (ppFVar1 == (FunctionData **)0x0) {
    pcVar4 = "void SmallArray<FunctionData *, 2>::push_back(const T &) [T = FunctionData *, N = 2]";
  }
  else {
    uVar3 = (pSVar5->functions).count;
    (pSVar5->functions).count = uVar3 + 1;
    ppFVar1[uVar3] = function;
    uVar3 = (this->functions).count;
    function->functionIndex = uVar3;
    if (uVar3 == (this->functions).max) {
      SmallArray<FunctionData_*,_128U>::grow(&this->functions,uVar3);
    }
    ppFVar1 = (this->functions).data;
    if (ppFVar1 != (FunctionData **)0x0) {
      uVar3 = (this->functions).count;
      (this->functions).count = uVar3 + 1;
      ppFVar1[uVar3] = function;
      pcVar4 = (function->name->name).begin;
      if ((pcVar4 != (char *)0x0) && (*pcVar4 != '$')) {
        pSVar5 = this->scope;
        if ((pSVar5->type | SCOPE_FUNCTION) == SCOPE_TYPE) {
          pSVar5 = this->globalScope;
        }
        uVar3 = NULLC::GetStringHash(pcVar4,(function->name->name).end);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = function;
        DirectChainedMap<IdentifierLookupResult>::insert
                  (&pSVar5->idLookupMap,uVar3,(IdentifierLookupResult)(auVar2 << 0x40));
        return;
      }
      return;
    }
    pcVar4 = 
    "void SmallArray<FunctionData *, 128>::push_back(const T &) [T = FunctionData *, N = 128]";
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,pcVar4);
}

Assistant:

void ExpressionContext::AddFunction(FunctionData *function)
{
	scope->functions.push_back(function);

	function->functionIndex = functions.size();

	functions.push_back(function);

	// Don't add internal functions to named lookup
	if(function->name->name.begin && *function->name->name.begin != '$')
	{
		// Type functions are available globally through member accessand namespaced functions are globally accessible through namespace name
		if(scope->type == SCOPE_TYPE || scope->type == SCOPE_NAMESPACE)
			globalScope->idLookupMap.insert(function->name->name.hash(), IdentifierLookupResult(function));
		else
			scope->idLookupMap.insert(function->name->name.hash(), IdentifierLookupResult(function));
	}
}